

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

void __thiscall QPlaceHolderItem::QPlaceHolderItem(QPlaceHolderItem *this,QWidget *w)

{
  long lVar1;
  bool bVar2;
  QRect *pQVar3;
  QWidget *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString((QString *)0x56c0de);
  QRect::QRect((QRect *)in_RSI);
  QObject::objectName();
  QString::operator=((QString *)in_RSI,in_RDI);
  QString::~QString((QString *)0x56c112);
  bVar2 = QWidget::isHidden((QWidget *)0x56c11c);
  *(bool *)&in_RDI[1].d.d = bVar2;
  bVar2 = QWidget::isWindow(in_RSI);
  *(bool *)((long)&in_RDI[1].d.d + 1) = bVar2;
  if (((ulong)in_RDI[1].d.d & 0x100) != 0) {
    pQVar3 = QWidget::geometry(in_RSI);
    *(undefined8 *)((long)&in_RDI[1].d.d + 4) = *(undefined8 *)pQVar3;
    *(undefined8 *)((long)&in_RDI[1].d.ptr + 4) = *(undefined8 *)&pQVar3->x2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QPlaceHolderItem::QPlaceHolderItem(QWidget *w)
{
    objectName = w->objectName();
    hidden = w->isHidden();
    window = w->isWindow();
    if (window)
        topLevelRect = w->geometry();
}